

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::UpsampleLayerParams::MergeFrom
          (UpsampleLayerParams *this,UpsampleLayerParams *from)

{
  int iVar1;
  void *pvVar2;
  LogMessage *pLVar3;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/build_O3/mlmodel/format/NeuralNetwork.pb.cc"
               ,0x902c);
    pLVar3 = google::protobuf::internal::LogMessage::operator<<
                       (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar3);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x4b2);
    pLVar3 = google::protobuf::internal::LogMessage::operator<<
                       (&local_50,"CHECK failed: (&other) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar3);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  iVar1 = (from->scalingfactor_).current_size_;
  if (iVar1 != 0) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve
              (&this->scalingfactor_,iVar1 + (this->scalingfactor_).current_size_);
    memcpy(((this->scalingfactor_).rep_)->elements + (this->scalingfactor_).current_size_,
           ((from->scalingfactor_).rep_)->elements,(long)(from->scalingfactor_).current_size_ << 3);
    (this->scalingfactor_).current_size_ =
         (this->scalingfactor_).current_size_ + (from->scalingfactor_).current_size_;
  }
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x4b2);
    pLVar3 = google::protobuf::internal::LogMessage::operator<<
                       (&local_50,"CHECK failed: (&other) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar3);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  iVar1 = (from->fractionalscalingfactor_).current_size_;
  if (iVar1 != 0) {
    google::protobuf::RepeatedField<float>::Reserve
              (&this->fractionalscalingfactor_,
               iVar1 + (this->fractionalscalingfactor_).current_size_);
    memcpy(((this->fractionalscalingfactor_).rep_)->elements +
           (this->fractionalscalingfactor_).current_size_,
           ((from->fractionalscalingfactor_).rep_)->elements,
           (long)(from->fractionalscalingfactor_).current_size_ << 2);
    (this->fractionalscalingfactor_).current_size_ =
         (this->fractionalscalingfactor_).current_size_ +
         (from->fractionalscalingfactor_).current_size_;
  }
  if (from->mode_ != 0) {
    this->mode_ = from->mode_;
  }
  if (from->linearupsamplemode_ != 0) {
    this->linearupsamplemode_ = from->linearupsamplemode_;
  }
  return;
}

Assistant:

void UpsampleLayerParams::MergeFrom(const UpsampleLayerParams& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.UpsampleLayerParams)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  scalingfactor_.MergeFrom(from.scalingfactor_);
  fractionalscalingfactor_.MergeFrom(from.fractionalscalingfactor_);
  if (from.mode() != 0) {
    set_mode(from.mode());
  }
  if (from.linearupsamplemode() != 0) {
    set_linearupsamplemode(from.linearupsamplemode());
  }
}